

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taggedptr.h
# Opt level: O1

void __thiscall pbrt::LightHandle::Preprocess(LightHandle *this,Bounds3f *sceneBounds)

{
  ulong uVar1;
  ushort uVar2;
  Point3<float> *center;
  ulong uVar3;
  Float *radius;
  anon_class_8_1_e43d4cc1 preprocess;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::PointLight,_pbrt::DistantLight,_pbrt::ProjectionLight,_pbrt::GoniometricLight,_pbrt::SpotLight,_pbrt::DiffuseAreaLight,_pbrt::UniformInfiniteLight,_pbrt::ImageInfiniteLight,_pbrt::PortalImageInfiniteLight>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  if (uVar1 >> 0x30 < 5) {
    if (uVar2 != 2) {
      return;
    }
  }
  else {
    if (uVar2 < 7) {
      return;
    }
    uVar3 = uVar1 & 0xffffffffffff;
    if (uVar1 >> 0x30 == 8) {
      center = (Point3<float> *)(uVar3 + 0x13c);
      radius = (Float *)(uVar3 + 0x148);
      goto LAB_003606b0;
    }
    if (uVar2 != 7) {
      center = (Point3<float> *)(uVar3 + 0x1f8);
      radius = (Float *)(uVar3 + 0x1d4);
      goto LAB_003606b0;
    }
  }
  center = (Point3<float> *)((uVar1 & 0xffffffffffff) + 0xc4);
  radius = (Float *)((uVar1 & 0xffffffffffff) + 0xd0);
LAB_003606b0:
  Bounds3<float>::BoundingSphere(sceneBounds,center,radius);
  return;
}

Assistant:

PBRT_CPU_GPU
    TaggedPointer(const TaggedPointer &t) { bits = t.bits; }